

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::solve(MultipleShootingSolver *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  long in_RDI;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
  *in_stack_ffffffffffffffb8;
  bool local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x18));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x316982);
    uVar2 = (*peVar3->_vptr_Optimizer[5])();
    if ((uVar2 & 1) == 0) {
      iDynTree::reportError
                ("MultipleShootingSolver","solve","Error when calling the optimizer solve method.");
      local_1 = false;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31699f);
      peVar4 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3169b2);
      uVar2 = (*peVar3->_vptr_Optimizer[6])(peVar3,&peVar4->m_solution);
      if ((uVar2 & 1) == 0) {
        iDynTree::reportError
                  ("MultipleShootingSolver","solve",
                   "Error while retrieving the primal variables from the optimizer.");
        local_1 = false;
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x316a23);
        peVar4->m_solved = true;
        std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
        shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                    *)peVar3,in_stack_ffffffffffffffb8);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x316a46);
        std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
        operator=((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                   *)peVar3,in_stack_ffffffffffffffb8);
        std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
        ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                     *)0x316a64);
        std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
        shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                    *)peVar3,in_stack_ffffffffffffffb8);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x316a80);
        std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
        operator=((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                   *)peVar3,in_stack_ffffffffffffffb8);
        std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
        ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                     *)0x316a9e);
        local_1 = true;
      }
    }
  }
  else {
    iDynTree::reportError("MultipleShootingSolver","solve","No optimizer selected.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MultipleShootingSolver::solve()
        {
            if (!m_optimizer){
                reportError("MultipleShootingSolver", "solve", "No optimizer selected.");
                return false;
            }
            if (m_optimizer->solve()){
                if (!(m_optimizer->getPrimalVariables(m_transcription->m_solution))){
                    reportError("MultipleShootingSolver", "solve", "Error while retrieving the primal variables from the optimizer.");
                    return false;
                }
            } else {
                reportError("MultipleShootingSolver", "solve", "Error when calling the optimizer solve method.");
                return false;
            }
            m_transcription->m_solved = true;

            m_transcription->m_stateGuesses = nullptr; //Guesses are used only once
            m_transcription->m_controlGuesses = nullptr;

            return true;
        }